

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O0

char * __thiscall Crypt::crypt(Crypt *this,char *__key,char *__salt)

{
  _Map_pointer ppiVar1;
  SequenceD<64> local_658;
  SequenceD<64> local_5a8;
  undefined1 local_4f8 [8];
  DES c2;
  SequenceD<64> local_398;
  undefined1 local_2e8 [8];
  DESinv d;
  SequenceD<64> local_228;
  SequenceD<64> local_178;
  undefined1 local_c8 [8];
  DES c1;
  SequenceD<64> *seq_local;
  Crypt *this_local;
  
  c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)__key;
  DES::DES((DES *)local_c8,&this->m_k1);
  SequenceD<64>::SequenceD
            (&local_228,
             (SequenceD<64> *)
             c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node);
  DES::operator()(&local_178,(DES *)local_c8,&local_228);
  SequenceD<64>::operator=
            ((SequenceD<64> *)
             c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node,&local_178);
  SequenceD<64>::~SequenceD(&local_178);
  SequenceD<64>::~SequenceD(&local_228);
  DESinv::DESinv((DESinv *)local_2e8,&this->m_k2);
  SequenceD<64>::SequenceD
            ((SequenceD<64> *)
             ((long)&c2.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data + 0x48),
             (SequenceD<64> *)
             c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node);
  DESinv::operator()(&local_398,(DESinv *)local_2e8,
                     (SequenceD<64> *)
                     ((long)&c2.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                             _M_impl.super__Deque_impl_data + 0x48));
  SequenceD<64>::operator=
            ((SequenceD<64> *)
             c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node,&local_398);
  SequenceD<64>::~SequenceD(&local_398);
  SequenceD<64>::~SequenceD
            ((SequenceD<64> *)
             ((long)&c2.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data + 0x48));
  DES::DES((DES *)local_4f8,&this->m_k1);
  SequenceD<64>::SequenceD
            (&local_658,
             (SequenceD<64> *)
             c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node);
  DES::operator()(&local_5a8,(DES *)local_4f8,&local_658);
  SequenceD<64>::operator=
            ((SequenceD<64> *)
             c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node,&local_5a8);
  SequenceD<64>::~SequenceD(&local_5a8);
  SequenceD<64>::~SequenceD(&local_658);
  ppiVar1 = c1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  DES::~DES((DES *)local_4f8);
  DESinv::~DESinv((DESinv *)local_2e8);
  DES::~DES((DES *)local_c8);
  return (char *)ppiVar1;
}

Assistant:

SequenceD<64> &Crypt::crypt(SequenceD<64> &seq) {
    DES c1(m_k1);
    seq = c1(seq);
    DESinv d(m_k2);
    seq = d(seq);
    DES c2(m_k1);
    seq = c2(seq);
    return seq;
}